

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O2

int pull_map(uchar **cursor,size_t *max,uchar *key,size_t key_len,wally_map *map_in,
            _func_int_uchar_ptr_size_t *check_fn)

{
  int iVar1;
  size_t len;
  uchar *value;
  
  pull_subfield_end(cursor,max,key,key_len);
  len = pull_varlength(cursor,max);
  value = pull_skip(cursor,max,len);
  iVar1 = map_add(map_in,key,key_len,value,len,false,wally_ec_public_key_verify,false);
  return iVar1;
}

Assistant:

static int pull_map(const unsigned char **cursor, size_t *max,
                    const unsigned char *key, size_t key_len,
                    struct wally_map *map_in,
                    int (*check_fn)(const unsigned char *key, size_t key_len))
{
    const unsigned char *val;
    size_t val_len;

    pull_subfield_end(cursor, max, key, key_len);

    val_len = pull_varlength(cursor, max);
    val = pull_skip(cursor, max, val_len);

    return map_add(map_in, key, key_len, val, val_len, false, check_fn, false);
}